

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O3

void BYTE_OUT1R3(dill_stream s,int insn1,int rex,int insn2,int insn3,int insn4)

{
  char **ppcVar1;
  char *pcVar2;
  char cVar3;
  byte bVar4;
  char cVar5;
  
  cVar3 = (char)insn2;
  cVar5 = (char)insn3;
  pcVar2 = s->p->cur_ip;
  if (s->p->code_limit <= pcVar2) {
    extend_dill_stream(s);
    pcVar2 = s->p->cur_ip;
  }
  if (rex == 0) {
    bVar4 = 0xf;
  }
  else {
    bVar4 = (byte)rex | 0x40;
    pcVar2[4] = cVar5;
    cVar5 = cVar3;
    cVar3 = '\x0f';
  }
  *pcVar2 = (char)insn1;
  pcVar2[1] = bVar4;
  pcVar2[2] = cVar3;
  pcVar2[3] = cVar5;
  if (s->dill_debug != 0) {
    dump_cur_dill_insn(s);
  }
  ppcVar1 = &s->p->cur_ip;
  *ppcVar1 = *ppcVar1 + (5 - (ulong)(rex == 0));
  return;
}

Assistant:

static void
BYTE_OUT1R3(dill_stream s, int insn1, int rex, int insn2, int insn3, int insn4)
{
    unsigned char* tmp_ip;
    if (s->p->cur_ip >= s->p->code_limit) {
        extend_dill_stream(s);
    }
    tmp_ip = (unsigned char*)s->p->cur_ip;
    if (rex != 0) {
        *(tmp_ip + 0) = (unsigned char)insn1;
        *(tmp_ip + 1) = (unsigned char)rex | 0x40;
        *(tmp_ip + 2) = (unsigned char)insn2;
        *(tmp_ip + 3) = (unsigned char)insn3;
        *(tmp_ip + 4) = (unsigned char)insn4;
    } else {
        *(tmp_ip) = (unsigned char)insn1;
        *(tmp_ip + 1) = (unsigned char)insn2;
        *(tmp_ip + 2) = (unsigned char)insn3;
        *(tmp_ip + 3) = (unsigned char)insn4;
    }
    if (s->dill_debug)
        dump_cur_dill_insn(s);
    s->p->cur_ip = ((char*)s->p->cur_ip) + 4;
    if (rex != 0)
        s->p->cur_ip++;
}